

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

secp256k1_context * secp256k1_context_preallocated_clone(secp256k1_context *ctx,void *prealloc)

{
  secp256k1_context *psVar1;
  void *pvVar2;
  char *pcVar3;
  
  if (ctx == (secp256k1_context *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/secp256k1.c"
            ,0x9a,"test condition failed: ctx != NULL");
    abort();
  }
  if (prealloc == (void *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "prealloc != NULL";
  }
  else {
    if ((ctx->ecmult_gen_ctx).built != 0) {
      psVar1 = (secp256k1_context *)memcpy(prealloc,ctx,0xe8);
      return psVar1;
    }
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "secp256k1_context_is_proper(ctx)";
  }
  (*(ctx->illegal_callback).fn)(pcVar3,pvVar2);
  return (secp256k1_context *)0x0;
}

Assistant:

secp256k1_context* secp256k1_context_preallocated_clone(const secp256k1_context* ctx, void* prealloc) {
    secp256k1_context* ret;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(prealloc != NULL);
    ARG_CHECK(secp256k1_context_is_proper(ctx));

    ret = (secp256k1_context*)prealloc;
    *ret = *ctx;
    return ret;
}